

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

HeapType __thiscall wasm::WasmBinaryBuilder::getIndexedHeapType(WasmBinaryBuilder *this)

{
  pointer pHVar1;
  uint32_t __val;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = getU32LEB(this);
  pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((ulong)__val <
      (ulong)((long)(this->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pHVar1 >> 3)) {
    return (HeapType)pHVar1[__val].id;
  }
  std::__cxx11::to_string(&local_58,__val);
  std::operator+(&local_38,"invalid heap type index: ",&local_58);
  throwError(this,&local_38);
}

Assistant:

HeapType WasmBinaryBuilder::getIndexedHeapType() {
  auto index = getU32LEB();
  if (index >= types.size()) {
    throwError("invalid heap type index: " + std::to_string(index));
  }
  return types[index];
}